

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::load_block_8_8(jpeg_encoder *this,int x,int y,int c)

{
  byte *pbVar1;
  int local_34;
  sample_array_t *psStack_30;
  int i;
  sample_array_t *pDst;
  uint8 *pSrc;
  int c_local;
  int y_local;
  int x_local;
  jpeg_encoder *this_local;
  
  psStack_30 = this->m_sample_array;
  for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
    pbVar1 = this->m_mcu_lines[y * 8 + local_34] + (x * 0x18 + c);
    *psStack_30 = *pbVar1 - 0x80;
    psStack_30[1] = pbVar1[3] - 0x80;
    psStack_30[2] = pbVar1[6] - 0x80;
    psStack_30[3] = pbVar1[9] - 0x80;
    psStack_30[4] = pbVar1[0xc] - 0x80;
    psStack_30[5] = pbVar1[0xf] - 0x80;
    psStack_30[6] = pbVar1[0x12] - 0x80;
    psStack_30[7] = pbVar1[0x15] - 0x80;
    psStack_30 = psStack_30 + 8;
  }
  return;
}

Assistant:

void jpeg_encoder::load_block_8_8(int x, int y, int c)
	{
		uint8* pSrc;
		sample_array_t* pDst = m_sample_array;
		x = (x * (8 * 3)) + c;
		y <<= 3;
		for (int i = 0; i < 8; i++, pDst += 8)
		{
			pSrc = m_mcu_lines[y + i] + x;
			pDst[0] = pSrc[0 * 3] - 128; pDst[1] = pSrc[1 * 3] - 128; pDst[2] = pSrc[2 * 3] - 128; pDst[3] = pSrc[3 * 3] - 128;
			pDst[4] = pSrc[4 * 3] - 128; pDst[5] = pSrc[5 * 3] - 128; pDst[6] = pSrc[6 * 3] - 128; pDst[7] = pSrc[7 * 3] - 128;
		}
	}